

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# I64ToI32Lowering.cpp
# Opt level: O2

Block * __thiscall
wasm::I64ToI32Lowering::lowerEq
          (I64ToI32Lowering *this,Block *result,TempVar *leftLow,TempVar *leftHigh,TempVar *rightLow
          ,TempVar *rightHigh)

{
  Builder *this_00;
  Builder *pBVar1;
  Builder *this_01;
  Index IVar2;
  LocalGet *pLVar3;
  LocalGet *pLVar4;
  Binary *pBVar5;
  Binary *right;
  Block *pBVar6;
  
  this_00 = (this->builder)._M_t.
            super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t.
            super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
            super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl;
  IVar2 = TempVar::operator_cast_to_unsigned_int(leftLow);
  pLVar3 = Builder::makeLocalGet(this_00,IVar2,(Type)0x2);
  pBVar1 = (this->builder)._M_t.
           super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t.
           super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
           super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl;
  IVar2 = TempVar::operator_cast_to_unsigned_int(rightLow);
  pLVar4 = Builder::makeLocalGet(pBVar1,IVar2,(Type)0x2);
  pBVar5 = Builder::makeBinary(this_00,EqInt32,(Expression *)pLVar3,(Expression *)pLVar4);
  pBVar1 = (this->builder)._M_t.
           super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t.
           super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
           super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl;
  IVar2 = TempVar::operator_cast_to_unsigned_int(leftHigh);
  pLVar3 = Builder::makeLocalGet(pBVar1,IVar2,(Type)0x2);
  this_01 = (this->builder)._M_t.
            super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t.
            super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
            super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl;
  IVar2 = TempVar::operator_cast_to_unsigned_int(rightHigh);
  pLVar4 = Builder::makeLocalGet(this_01,IVar2,(Type)0x2);
  right = Builder::makeBinary(pBVar1,EqInt32,(Expression *)pLVar3,(Expression *)pLVar4);
  pBVar5 = Builder::makeBinary(this_00,AndInt32,(Expression *)pBVar5,(Expression *)right);
  pBVar6 = Builder::blockify(this_00,(Expression *)result,(Expression *)pBVar5);
  return pBVar6;
}

Assistant:

Block* lowerEq(Block* result,
                 TempVar&& leftLow,
                 TempVar&& leftHigh,
                 TempVar&& rightLow,
                 TempVar&& rightHigh) {
    return builder->blockify(
      result,
      builder->makeBinary(
        AndInt32,
        builder->makeBinary(EqInt32,
                            builder->makeLocalGet(leftLow, Type::i32),
                            builder->makeLocalGet(rightLow, Type::i32)),
        builder->makeBinary(EqInt32,
                            builder->makeLocalGet(leftHigh, Type::i32),
                            builder->makeLocalGet(rightHigh, Type::i32))));
  }